

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

char * deqp::gls::MemObjectAllocator::resultToString(Result result)

{
  char *pcStack_10;
  Result result_local;
  
  switch(result) {
  case RESULT_GOT_BAD_ALLOC:
    pcStack_10 = "Caught std::bad_alloc";
    break;
  case RESULT_GEN_TEXTURES_FAILED:
    pcStack_10 = "glGenTextures failed";
    break;
  case RESULT_GEN_BUFFERS_FAILED:
    pcStack_10 = "glGenBuffers failed";
    break;
  case RESULT_BUFFER_DATA_FAILED:
    pcStack_10 = "glBufferData failed";
    break;
  case RESULT_BUFFER_SUB_DATA_FAILED:
    pcStack_10 = "glBufferSubData failed";
    break;
  case RESULT_TEXTURE_IMAGE_FAILED:
    pcStack_10 = "glTexImage2D failed";
    break;
  case RESULT_TEXTURE_SUB_IMAGE_FAILED:
    pcStack_10 = "glTexSubImage2D failed";
    break;
  case RESULT_BIND_TEXTURE_FAILED:
    pcStack_10 = "glBindTexture failed";
    break;
  case RESULT_BIND_BUFFER_FAILED:
    pcStack_10 = "glBindBuffer failed";
    break;
  case RESULT_DELETE_TEXTURES_FAILED:
    pcStack_10 = "glDeleteTextures failed";
    break;
  case RESULT_DELETE_BUFFERS_FAILED:
    pcStack_10 = "glDeleteBuffers failed";
    break;
  case RESULT_RENDER_FAILED:
    pcStack_10 = "Rendering result failed";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* MemObjectAllocator::resultToString (Result result)
{
	switch (result)
	{
		case RESULT_GOT_BAD_ALLOC:
			return "Caught std::bad_alloc";
			break;

		case RESULT_GEN_TEXTURES_FAILED:
			return "glGenTextures failed";
			break;

		case RESULT_GEN_BUFFERS_FAILED:
			return "glGenBuffers failed";
			break;

		case RESULT_BUFFER_DATA_FAILED:
			return "glBufferData failed";
			break;

		case RESULT_BUFFER_SUB_DATA_FAILED:
			return "glBufferSubData failed";
			break;

		case RESULT_TEXTURE_IMAGE_FAILED:
			return "glTexImage2D failed";
			break;

		case RESULT_TEXTURE_SUB_IMAGE_FAILED:
			return "glTexSubImage2D failed";
			break;

		case RESULT_BIND_TEXTURE_FAILED:
			return "glBindTexture failed";
			break;

		case RESULT_BIND_BUFFER_FAILED:
			return "glBindBuffer failed";
			break;

		case RESULT_DELETE_TEXTURES_FAILED:
			return "glDeleteTextures failed";
			break;

		case RESULT_DELETE_BUFFERS_FAILED:
			return "glDeleteBuffers failed";
			break;

		case RESULT_RENDER_FAILED:
			return "Rendering result failed";
			break;

		default:
			DE_ASSERT(false);
			return NULL;
	}
}